

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleExtract(TranslateToFuzzReader *this,Type type)

{
  value_type_conflict3 vVar1;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar2;
  TranslateToFuzzReader *this_00;
  char cVar3;
  bool bVar4;
  uint32_t uVar5;
  Type *pTVar6;
  uintptr_t *puVar7;
  value_type_conflict3 *pvVar8;
  Expression *tuple;
  TupleExtract *pTVar9;
  undefined1 auVar10 [8];
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar11;
  Iterator __last;
  Iterator __first;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_b0;
  ulong local_98;
  size_t injected;
  TranslateToFuzzReader *local_88;
  value_type_conflict3 local_80;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> extractIndices;
  undefined1 local_58 [8];
  Iterator __begin1;
  Type local_40;
  Type tupleType;
  Type type_local;
  
  tupleType = type;
  cVar3 = wasm::Type::isDefaultable();
  if (cVar3 == '\0') {
    pTVar9 = (TupleExtract *)makeTrivial(this,tupleType);
  }
  else {
    if (((byte)this->wasm[0x109] & 2) == 0) {
      __assert_fail("wasm.features.hasMultivalue()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x61f,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    bVar4 = Type::isSingle(&tupleType);
    if ((!bVar4) || (tupleType.id < 2)) {
      __assert_fail("type.isSingle() && type.isConcrete()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x620,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    local_88 = this;
    local_40 = getTupleType(this);
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    i = 0;
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_80 = 0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_58 = (undefined1  [8])&local_40;
    PVar11 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_40);
    pTVar6 = (Type *)0x0;
    auVar10 = (undefined1  [8])&local_40;
    while (this_00 = local_88, PVar2.index = (size_t)pTVar6, PVar2.parent = (Type *)auVar10,
          PVar11 != PVar2) {
      puVar7 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
      if (*puVar7 == tupleType.id) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&local_80);
      }
      local_80 = local_80 + 1;
      pTVar6 = (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
      auVar10 = local_58;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar6;
    }
    if (extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)i) {
      __last = Type::end(&local_40);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_40
      ;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)local_58,__first,__last,
                 (allocator_type *)&local_b0);
      uVar5 = Random::upTo(&this_00->random,
                           (uint32_t)
                           ((ulong)((long)__begin1.
                                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                          .parent - (long)local_58) >> 3));
      local_98 = (ulong)uVar5;
      ((Type *)((long)local_58 + local_98 * 8))->id = tupleType.id;
      Tuple::Tuple((Tuple *)&local_b0,(TypeList *)local_58);
      wasm::Type::Type((Type *)&injected,(Tuple *)&local_b0);
      local_40.id = injected;
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_b0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,&local_98);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_58);
    }
    pvVar8 = Random::pick<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this_00->random,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i
                       );
    vVar1 = *pvVar8;
    tuple = make(this_00,local_40);
    pTVar9 = Builder::makeTupleExtract(&this_00->builder,tuple,(Index)vVar1);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  }
  return (Expression *)pTVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleExtract(Type type) {
  // Tuples can require locals in binary format conversions.
  if (!type.isDefaultable()) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasMultivalue());
  assert(type.isSingle() && type.isConcrete());
  Type tupleType = getTupleType();

  // Find indices from which we can extract `type`
  std::vector<size_t> extractIndices;
  size_t i = 0;
  for (const auto& t : tupleType) {
    if (t == type) {
      extractIndices.push_back(i);
    }
    ++i;
  }

  // If there are none, inject one
  if (extractIndices.size() == 0) {
    std::vector<Type> newElements(tupleType.begin(), tupleType.end());
    size_t injected = upTo(newElements.size());
    newElements[injected] = type;
    tupleType = Type(newElements);
    extractIndices.push_back(injected);
  }

  Index index = pick(extractIndices);
  Expression* child = make(tupleType);
  return builder.makeTupleExtract(child, index);
}